

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

string * __thiscall
wallet::CWallet::GetDisplayName_abi_cxx11_(string *__return_storage_ptr__,CWallet *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string wallet_name;
  allocator<char> local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_name)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"default wallet",&local_31);
  }
  else {
    std::__cxx11::string::string(local_30,&this->m_name);
  }
  tinyformat::format<std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)0x700208,(char *)local_30,in_RCX);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string GetDisplayName() const override
    {
        std::string wallet_name = GetName().length() == 0 ? "default wallet" : GetName();
        return strprintf("[%s]", wallet_name);
    }